

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O3

void __thiscall
YacclabTests::SaveAverageWithStepsResults
          (YacclabTests *this,string *os_name,string *dataset_name,bool rounded)

{
  pointer pbVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  char cVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  StreamDemultiplexer *this_00;
  StepType n_step;
  long lVar8;
  long lVar9;
  key_type *pkVar10;
  double dVar11;
  ofstream os;
  char local_291;
  string local_290;
  double local_270;
  string *local_268;
  YacclabTests *local_260;
  string local_258;
  undefined8 local_238;
  long local_230;
  filebuf local_228 [16];
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  local_260 = this;
  std::ofstream::ofstream(&local_230,(string *)os_name,_S_out);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    this_00 = StreamDemultiplexer::operator<<
                        ((StreamDemultiplexer *)&dmux::cout,
                         (char (*) [31])"Unable to save average results");
    local_290._M_dataplus._M_p._0_1_ = 10;
    StreamDemultiplexer::operator<<(this_00,(char *)&local_290);
  }
  else {
    local_268 = dataset_name;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#Algorithm",10);
    local_290._M_dataplus._M_p._0_1_ = 9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_290,1);
    n_step = ALLOC_DEALLOC;
    do {
      Step_abi_cxx11_(&local_290,n_step);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (char *)CONCAT71(local_290._M_dataplus._M_p._1_7_,
                                           local_290._M_dataplus._M_p._0_1_),
                          local_290._M_string_length);
      local_258._M_dataplus._M_p._0_1_ = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_258,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_) !=
          &local_290.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_),
                        local_290.field_2._M_allocated_capacity + 1);
      }
      n_step = n_step + FIRST_SCAN;
    } while (n_step != ST_SIZE);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Total",5);
    local_290._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_290,1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
             ::at(&local_260->average_ws_results_,local_268);
    if (0 < *(int *)&pmVar7->field_0x8) {
      local_238 = 8;
      if (rounded) {
        local_238 = 2;
      }
      lVar8 = 0;
      do {
        pbVar1 = (local_260->mode_cfg_->ccl_average_ws_algorithms).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = pbVar1[lVar8]._M_dataplus._M_p;
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,pcVar2,pcVar2 + pbVar1[lVar8]._M_string_length);
        DoubleEscapeUnderscore(&local_290,&local_258);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,
                            (char *)CONCAT71(local_290._M_dataplus._M_p._1_7_,
                                             local_290._M_dataplus._M_p._0_1_),
                            local_290._M_string_length);
        local_291 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_291,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_) !=
            &local_290.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_
                                  ),local_290.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (*(int *)&pmVar7->field_0xc < 1) {
          pkVar10 = (key_type *)0x0;
        }
        else {
          pkVar10 = (key_type *)0x0;
          lVar9 = 0;
          do {
            lVar3 = *(long *)&pmVar7->field_0x10;
            plVar4 = *(long **)&pmVar7->field_0x48;
            dVar11 = *(double *)(*plVar4 * lVar8 + lVar3 + lVar9 * 8);
            local_268 = pkVar10;
            if (rounded) {
              local_270 = floor(dVar11 * 100.0 + 0.5);
              *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
                   *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 4;
              *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 2;
              poVar6 = std::ostream::_M_insert<double>
                                 (*(double *)(lVar3 + *plVar4 * lVar8 + lVar9 * 8));
              local_290._M_dataplus._M_p._0_1_ = 9;
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_290,1);
              dVar11 = local_270 / 100.0;
            }
            else {
              *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
                   *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 4;
              *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 8;
              local_270 = dVar11;
              poVar6 = std::ostream::_M_insert<double>
                                 (*(double *)(lVar3 + *plVar4 * lVar8 + lVar9 * 8));
              local_290._M_dataplus._M_p._0_1_ = 9;
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_290,1);
              dVar11 = local_270;
            }
            pkVar10 = (key_type *)((double)local_268 + dVar11);
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)&pmVar7->field_0xc);
        }
        *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
             *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = local_238;
        std::ostream::_M_insert<double>((double)pkVar10);
        local_290._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(char *)&local_290,1);
        lVar8 = lVar8 + 1;
      } while (lVar8 < *(int *)&pmVar7->field_0x8);
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _operator__;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void YacclabTests::SaveAverageWithStepsResults(const std::string& os_name, const std::string& dataset_name, bool rounded) {
    std::ofstream os(os_name);
    if (!os.is_open()) {
        dmux::cout << "Unable to save average results" << '\n';
        return;
    }

    // Write heading string in output stream
    os << "#Algorithm" << '\t';
    for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
        StepType step = static_cast<StepType>(step_number);
        os << Step(step) << '\t';
    }
    os << "Total" << '\n';

    const auto& results = average_ws_results_.at(dataset_name);

    for (int r = 0; r < results.rows; ++r) {
        const auto& algo_name = mode_cfg_.ccl_average_ws_algorithms[r];
        double cumulative_sum{ 0.0 };

        // Gnuplot requires double-escaped name when underscores are encountered
        //{
        //    string algo_name_double_escaped{ algo_name };
        //    std::size_t found = algo_name_double_escaped.find_first_of("_");
        //    while (found != std::string::npos) {
        //        algo_name_double_escaped.insert(found, "\\\\");
        //        found = algo_name_double_escaped.find_first_of("_", found + 3);
        //    }
        //    os << algo_name_double_escaped << '\t';
        //}
        os << DoubleEscapeUnderscore(std::string(algo_name)) << '\t';

        for (int c = 0; c < results.cols; ++c) {
            if (rounded) {
                cumulative_sum += floor(results(r, c) * 100.00 + 0.5) / 100.00;
                os << std::fixed << std::setprecision(2) << results(r, c) << '\t';
            }
            else {
                cumulative_sum += results(r, c);
                os << std::fixed << std::setprecision(8) << results(r, c) << '\t';
            }
        }
        // Write cumulative_sum as total
        if (rounded) {
            os << std::fixed << std::setprecision(2) << cumulative_sum;
        }
        else {
            os << std::fixed << std::setprecision(8) << cumulative_sum;
        }
        os << '\n';
    }
    os.close();
}